

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArticulatedPart.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::ArticulatedPart::Decode(ArticulatedPart *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0xf < KVar1) {
    KDataStream::Read(stream,&(this->super_VariableParameter).m_ui8VarParamType);
    KDataStream::Read(stream,&this->m_ui8ParmeterChange);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16AttachementID);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32ParamTypeVariant);
    KDataStream::Read<float>(stream,(float *)&this->m_f32ParamValue);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32Padding);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void ArticulatedPart::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < VariableParameter::VARIABLE_PARAMETER_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui8VarParamType
           >> m_ui8ParmeterChange
           >> m_ui16AttachementID
           >> m_ui32ParamTypeVariant
           >> m_f32ParamValue
           >> m_ui32Padding;
}